

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

uchar * __thiscall Overlay_Window::read_image(Overlay_Window *this,int *ww,int *hh)

{
  int iVar1;
  Window WVar2;
  Window WVar3;
  Fl_Surface_Device *pFVar4;
  Fl_Display_Device *pFVar5;
  uchar *puVar6;
  
  Fl_Window::make_current((Fl_Window *)this);
  *ww = (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
        super_Fl_Widget.w_;
  iVar1 = (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
          super_Fl_Widget.h_;
  *hh = iVar1;
  WVar3 = XCreatePixmap(fl_display,
                        *(undefined8 *)
                         (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),*ww,iVar1,
                        fl_visual->depth);
  WVar2 = fl_window;
  pFVar4 = Fl_Surface_Device::_surface;
  fl_window = WVar3;
  if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
    pFVar4 = Fl_Surface_Device::default_surface();
  }
  pFVar5 = Fl_Display_Device::display_device();
  (*(pFVar5->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
  if ((this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.i == (Fl_X *)0x0) {
    (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget.label_.image = Fl::scheme_bg_;
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  (*(this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget._vptr_Fl_Widget[2])();
  puVar6 = fl_read_image((uchar *)0x0,0,0,*ww,*hh,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_window = WVar2;
  (*(pFVar4->super_Fl_Device)._vptr_Fl_Device[3])(pFVar4);
  XFreePixmap(fl_display,WVar3);
  Fl_Window::make_current(main_window);
  return puVar6;
}

Assistant:

uchar *Overlay_Window::read_image(int &ww, int &hh) {
  // Create an off-screen buffer for the window...
  //main_window->make_current();
  make_current();

  ww = w();
  hh = h();

  Fl_Offscreen offscreen = fl_create_offscreen(ww, hh);
  uchar *pixels;

  // Redraw the window into the offscreen buffer...
  fl_begin_offscreen(offscreen);

  if (!shown()) image(Fl::scheme_bg_);

  redraw();
  draw();

  // Read the screen image...
  pixels = fl_read_image(0, 0, 0, ww, hh);

  fl_end_offscreen();

  // Cleanup and return...
  fl_delete_offscreen(offscreen);
  main_window->make_current();
  return pixels;
}